

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenTypeName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  uint uVar1;
  BaseType BVar2;
  char *__lhs;
  string bits;
  string local_30;
  
  if (0x12 < (ulong)type->base_type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
  }
  NumToString<unsigned_long>
            (&local_30,*(unsigned_long *)(&DAT_00371e08 + (ulong)type->base_type * 8));
  BVar2 = type->base_type;
  uVar1 = BVar2 - BASE_TYPE_UTYPE;
  if (uVar1 < 10) {
    if (uVar1 < 10) {
      __lhs = &DAT_00371ea0 + *(int *)(&DAT_00371ea0 + (ulong)uVar1 * 4);
    }
    else {
      __lhs = "int";
    }
  }
  else {
    if (1 < BVar2 - BASE_TYPE_FLOAT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (BVar2 == BASE_TYPE_STRUCT) {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"table","")
        ;
      }
      else if (BVar2 == BASE_TYPE_STRING) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"string","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"none","");
      }
      goto LAB_002a0134;
    }
    __lhs = "float";
  }
  std::operator+(__return_storage_ptr__,__lhs,&local_30);
LAB_002a0134:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName(const Type &type) {
    auto bits = NumToString(SizeOf(type.base_type) * 8);
    if (IsInteger(type.base_type)) {
      if (IsUnsigned(type.base_type))
        return "uint" + bits;
      else
        return "int" + bits;
    }
    if (IsFloat(type.base_type)) return "float" + bits;
    if (IsString(type)) return "string";
    if (type.base_type == BASE_TYPE_STRUCT) return "table";
    return "none";
  }